

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_scanComment(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  int iVar4;
  char cVar5;
  
  if (ptr == end) {
    return -1;
  }
  iVar4 = 0;
  if ((*ptr == '\0') && (iVar4 = 0, ptr[1] == '-')) {
    pbVar1 = (byte *)(ptr + 2);
joined_r0x0015eb8e:
    do {
      pbVar3 = pbVar1;
      if (pbVar3 == (byte *)end) {
        return -1;
      }
      bVar2 = *pbVar3;
      if (bVar2 < 0xdc) {
        cVar5 = '\a';
        if (3 < bVar2 - 0xd8) {
          if (bVar2 == 0) {
            cVar5 = *(char *)((long)enc[1].scanners + (ulong)pbVar3[1]);
          }
          else {
LAB_0015ebf1:
            cVar5 = '\x1d';
          }
        }
      }
      else if (bVar2 - 0xdc < 4) {
        cVar5 = '\b';
      }
      else {
        if ((bVar2 != 0xff) || (pbVar3[1] < 0xfe)) goto LAB_0015ebf1;
        cVar5 = '\0';
      }
      ptr = (char *)pbVar3;
      switch(cVar5) {
      case '\0':
      case '\x01':
      case '\b':
        goto switchD_0015ec05_caseD_0;
      case '\x05':
        if ((long)end - (long)pbVar3 < 2) {
          return -2;
        }
      case '\x02':
      case '\x03':
      case '\x04':
switchD_0015ec05_caseD_2:
        pbVar1 = pbVar3 + 2;
        goto joined_r0x0015eb8e;
      case '\x06':
        if ((long)end - (long)pbVar3 < 3) {
          return -2;
        }
        pbVar1 = pbVar3 + 3;
        goto joined_r0x0015eb8e;
      case '\a':
        if ((long)end - (long)pbVar3 < 4) {
          return -2;
        }
        pbVar1 = pbVar3 + 4;
        goto joined_r0x0015eb8e;
      }
      if (cVar5 != '\x1b') goto switchD_0015ec05_caseD_2;
      pbVar1 = pbVar3 + 2;
      if (pbVar1 == (byte *)end) {
        return -1;
      }
    } while ((*pbVar1 != 0) || (pbVar3[3] != 0x2d));
    ptr = (char *)(pbVar3 + 4);
    if (ptr == end) {
      return -1;
    }
    iVar4 = 0;
    if (*ptr == 0) {
      if (pbVar3[5] == 0x3e) {
        ptr = (char *)(pbVar3 + 6);
      }
      iVar4 = 0xd;
      if (pbVar3[5] != 0x3e) {
        iVar4 = 0;
      }
    }
  }
switchD_0015ec05_caseD_0:
  *nextTokPtr = ptr;
  return iVar4;
}

Assistant:

static
int PREFIX(scanComment)(const ENCODING *enc, const char *ptr, const char *end,
                        const char **nextTokPtr)
{
  if (ptr != end) {
    if (!CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
    ptr += MINBPC(enc);
    while (ptr != end) {
      switch (BYTE_TYPE(enc, ptr)) {
      INVALID_CASES(ptr, nextTokPtr)
      case BT_MINUS:
        if ((ptr += MINBPC(enc)) == end)
          return XML_TOK_PARTIAL;
        if (CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
          if ((ptr += MINBPC(enc)) == end)
            return XML_TOK_PARTIAL;
          if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_COMMENT;
        }
        break;
      default:
        ptr += MINBPC(enc);
        break;
      }
    }
  }
  return XML_TOK_PARTIAL;
}